

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileformat.cpp
# Opt level: O2

bool trackerboy::upgradeHeader(Header *header)

{
  uint8_t uVar1;
  uint16_t uVar2;
  
  if ((header->rev0).revision != '\0') {
    return true;
  }
  if (0xff < (header->rev0).numberOfWaveforms || 0xff < (header->rev0).numberOfInstruments) {
    return false;
  }
  uVar2 = (header->rev0).customFramerate;
  uVar1 = (header->rev0).system;
  *(uint8_t *)((long)header + 0x18) = '\x01';
  *(uint8_t *)((long)header + 0x19) = '\0';
  *(uint16_t *)((long)header + 0x1a) = 0;
  (header->rev1).icount = (uint8_t)(header->rev0).numberOfInstruments;
  (header->rev1).scount = '\0';
  (header->rev1).wcount = (uint8_t)(header->rev0).numberOfWaveforms;
  (header->rev1).system = uVar1;
  (header->rev1).customFramerate = uVar2;
  return true;
}

Assistant:

bool upgradeHeader(Header &header) noexcept {

    // upgrade incrementally to the current major
    switch (header.current.revMajor) {
        case 0: {
            // 0 -> 1 changes in header:
            // system, customFramerate moved to offset 127 (after wcount)
            // revision -> revMajor
            // system -> revMinor
            // customFramerate -> reserved
            auto const system = header.rev0.system;
            auto const framerate = header.rev0.customFramerate;
            auto const instruments = header.rev0.numberOfInstruments;
            auto const waveforms = header.rev0.numberOfWaveforms;

            constexpr auto maxbyte = std::numeric_limits<uint8_t>::max();
            if (instruments > maxbyte || waveforms > maxbyte) {
                return false;
            }

            header.rev1.revMajor = 1;
            header.rev1.revMinor = 0;
            header.rev1.reserved = 0;
            header.rev1.icount = (uint8_t)instruments;
            header.rev1.scount = bias(1);
            header.rev1.wcount = (uint8_t)waveforms;
            header.rev1.system = system;
            header.rev1.customFramerate = framerate;
        }
            [[fallthrough]];
        default:
            return true;
    }
}